

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Access_block_grid(int g_a,int *index,void *ptr,int *ld)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  Integer *pIVar4;
  int *piVar5;
  Integer _ga_lo [7];
  Integer _ga_work [7];
  Integer aIStack_a8 [8];
  Integer local_68 [8];
  
  IVar1 = pnga_ndim((long)g_a);
  lVar2 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  pIVar4 = aIStack_a8 + IVar1;
  for (; pIVar4 = pIVar4 + -1, lVar3 != lVar2; lVar2 = lVar2 + 1) {
    *pIVar4 = (long)index[lVar2];
  }
  pnga_access_block_grid_ptr((long)g_a,aIStack_a8,ptr,local_68);
  lVar2 = 0;
  lVar3 = IVar1 + -1;
  if (IVar1 + -1 < 1) {
    lVar3 = lVar2;
  }
  piVar5 = ld + IVar1 + -2;
  for (; lVar3 != lVar2; lVar2 = lVar2 + 1) {
    *piVar5 = (int)local_68[lVar2];
    piVar5 = piVar5 + -1;
  }
  return;
}

Assistant:

void NGA_Access_block_grid(int g_a, int index[], void *ptr, int ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_work[MAXDIM], _ga_lo[MAXDIM];
     COPYC2F(index, _ga_lo, ndim);
     wnga_access_block_grid_ptr(a,_ga_lo,ptr,_ga_work);
     COPYF2C(_ga_work,ld, ndim-1);
}